

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall PeleLM::checkPoint(PeleLM *this,string *dir,ostream *os,How how,bool dump_old)

{
  double dVar1;
  undefined8 uVar2;
  bool bVar3;
  byte bVar4;
  _Ios_Openmode _Var5;
  _Ios_Openmode _Var6;
  int iVar7;
  Long LVar8;
  double *pdVar9;
  char *pcVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ostream *poVar11;
  int j;
  int i_00;
  long in_RDI;
  byte in_R8B;
  int step;
  string PAMBFileName;
  ofstream PAMBFile;
  IO_Buffer io_buffer;
  int i;
  FArrayBox tvfab;
  int nComp;
  Box tvbox;
  ofstream tvos;
  string tvfile;
  IntVect tmp;
  Arena *in_stack_fffffffffffff968;
  Amr *in_stack_fffffffffffff970;
  undefined4 in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff97c;
  FArrayBox *in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff988;
  undefined4 in_stack_fffffffffffff98c;
  char *in_stack_fffffffffffff990;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff998;
  string *in_stack_fffffffffffff9a8;
  string *file;
  string local_5f8 [32];
  long local_5d8 [60];
  bool in_stack_fffffffffffffc0b;
  How in_stack_fffffffffffffc0c;
  ostream *in_stack_fffffffffffffc10;
  string *in_stack_fffffffffffffc18;
  NavierStokesBase *in_stack_fffffffffffffc20;
  undefined1 local_3d1 [29];
  int local_3b4;
  int local_364;
  int local_360 [2];
  int local_358;
  int local_350 [2];
  int local_348;
  int local_340;
  int iStack_33c;
  int local_338;
  int local_330 [2];
  int local_328;
  IntVect local_320 [3];
  char local_2f8 [528];
  string local_e8 [32];
  string local_c8 [35];
  byte local_a5;
  int local_88 [2];
  int local_80;
  int *local_78;
  int local_70;
  IntVect local_6c;
  int local_60 [2];
  int local_58;
  int local_4c;
  IntVect local_48;
  int local_3c;
  IntVect *local_38;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_a5 = in_R8B & 1;
  NavierStokesBase::checkPoint
            (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
             in_stack_fffffffffffffc0c,in_stack_fffffffffffffc0b);
  if ((*(int *)(in_RDI + 8) == 0) && (bVar3 = amrex::ParallelDescriptor::IOProcessor(), bVar3)) {
    std::operator+(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff970);
    std::__cxx11::string::~string(local_e8);
    std::ofstream::ofstream(local_2f8);
    _Var5 = std::__cxx11::string::c_str();
    _Var6 = std::operator|(_S_out,_S_trunc);
    std::operator|(_Var6,_S_bin);
    std::ofstream::open(local_2f8,_Var5);
    bVar4 = std::ios::good();
    if ((bVar4 & 1) == 0) {
      amrex::FileOpenFailed(in_stack_fffffffffffff9a8);
    }
    amrex::IntVect::IntVect(local_320);
    iVar7 = NavierStokesBase::NUM_STATE + -1;
    local_4c = 0;
    amrex::IntVect::IntVect(&local_48);
    local_3c = local_4c;
    local_48.vect[local_4c] = 1;
    local_58 = local_48.vect[2];
    local_60[0] = local_48.vect[0];
    local_60[1] = local_48.vect[1];
    local_348 = local_48.vect[2];
    local_350[0] = local_48.vect[0];
    local_350[1] = local_48.vect[1];
    local_338 = local_48.vect[2];
    local_340 = local_48.vect[0];
    iStack_33c = local_48.vect[1];
    uVar2 = _local_340;
    local_78 = &local_340;
    local_c = 0;
    local_340 = local_48.vect[0];
    i_00 = iVar7 * local_340;
    local_1c = 1;
    iStack_33c = local_48.vect[1];
    j = iVar7 * iStack_33c;
    local_2c = 2;
    _local_340 = uVar2;
    local_70 = iVar7;
    local_38 = &local_48;
    local_28 = local_78;
    local_18 = local_78;
    local_8 = local_78;
    amrex::IntVect::IntVect(&local_6c,i_00,j,iVar7 * local_48.vect[2]);
    local_80 = local_6c.vect[2];
    local_88[0] = local_6c.vect[0];
    local_88[1] = local_6c.vect[1];
    local_358 = local_6c.vect[2];
    local_360[0] = local_6c.vect[0];
    local_360[1] = local_6c.vect[1];
    local_328 = local_6c.vect[2];
    local_330[0] = local_6c.vect[0];
    local_330[1] = local_6c.vect[1];
    amrex::Box::Box((Box *)in_stack_fffffffffffff970,(IntVect *)in_stack_fffffffffffff968,
                    (IntVect *)0x4f3d57);
    LVar8 = amrex::Vector<double,_std::allocator<double>_>::size
                      ((Vector<double,_std::allocator<double>_> *)0x4f3d63);
    local_364 = (int)LVar8;
    amrex::FArrayBox::FArrayBox
              (in_stack_fffffffffffff980,
               (Box *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
               (int)((ulong)in_stack_fffffffffffff970 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffff970 >> 0x18,0),
               SUB81((ulong)in_stack_fffffffffffff970 >> 0x10,0),in_stack_fffffffffffff968);
    for (local_3b4 = 0; local_3b4 < local_364; local_3b4 = local_3b4 + 1) {
      pdVar9 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff970,
                          (size_type)in_stack_fffffffffffff968);
      dVar1 = *pdVar9;
      pdVar9 = amrex::BaseFab<double>::dataPtr
                         ((BaseFab<double> *)
                          CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                          (int)((ulong)in_stack_fffffffffffff980 >> 0x20));
      pdVar9[local_3b4] = dVar1;
    }
    amrex::FArrayBox::writeOn
              (in_stack_fffffffffffff980,
               (ostream *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
    amrex::FArrayBox::~FArrayBox((FArrayBox *)0x4f3e22);
    std::ofstream::~ofstream(local_2f8);
    std::__cxx11::string::~string(local_c8);
  }
  if (closed_chamber != 0) {
    file = (string *)local_3d1;
    std::allocator<char>::allocator();
    amrex::Vector<char,_std::allocator<char>_>::vector
              ((Vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff970,
               (size_type)in_stack_fffffffffffff968,(allocator_type *)0x4f3eb6);
    iVar7 = (int)((ulong)in_stack_fffffffffffff968 >> 0x20);
    std::allocator<char>::~allocator((allocator<char> *)local_3d1);
    bVar3 = amrex::ParallelDescriptor::IOProcessor();
    if (bVar3) {
      std::ofstream::ofstream(local_5d8);
      pcVar10 = (char *)std::ofstream::rdbuf();
      __rhs = local_3d1 + 1;
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              amrex::Vector<char,_std::allocator<char>_>::dataPtr
                        ((Vector<char,_std::allocator<char>_> *)0x4f3f08);
      amrex::Vector<char,_std::allocator<char>_>::size
                ((Vector<char,_std::allocator<char>_> *)0x4f3f17);
      std::streambuf::pubsetbuf(pcVar10,(long)__lhs);
      std::operator+(__lhs,__rhs);
      _Var5 = std::__cxx11::string::c_str();
      _Var6 = std::operator|(_S_out,_S_trunc);
      std::operator|(_Var6,_S_bin);
      std::ofstream::open((char *)local_5d8,_Var5);
      bVar4 = std::ios::good();
      if ((bVar4 & 1) == 0) {
        amrex::FileOpenFailed(file);
      }
      std::ios_base::precision((ios_base *)((long)local_5d8 + *(long *)(local_5d8[0] + -0x18)),0x11)
      ;
      iVar7 = amrex::Amr::levelSteps(in_stack_fffffffffffff970,iVar7);
      std::operator<<((ostream *)local_5d8,"Writing p_amb to checkpoint\n");
      if (iVar7 == 0) {
        poVar11 = (ostream *)std::ostream::operator<<(local_5d8,p_amb_old);
        std::operator<<(poVar11,"\n");
      }
      else {
        poVar11 = (ostream *)std::ostream::operator<<(local_5d8,p_amb_new);
        std::operator<<(poVar11,"\n");
      }
      std::__cxx11::string::~string(local_5f8);
      std::ofstream::~ofstream(local_5d8);
    }
    amrex::Vector<char,_std::allocator<char>_>::~Vector
              ((Vector<char,_std::allocator<char>_> *)0x4f414d);
  }
  return;
}

Assistant:

void
PeleLM::checkPoint (const std::string& dir,
                    std::ostream&      os,
                    VisMF::How         how,
                    bool               dump_old)
{
  NavierStokesBase::checkPoint(dir,os,how,dump_old);

  if (level == 0)
  {
    if (ParallelDescriptor::IOProcessor())
    {
      const std::string tvfile = dir + "/" + typical_values_filename;
      std::ofstream tvos;
      tvos.open(tvfile.c_str(),std::ios::out|std::ios::trunc|std::ios::binary);
      if (!tvos.good())
        amrex::FileOpenFailed(tvfile);
      Box tvbox(IntVect(),(NUM_STATE-1)*amrex::BASISV(0));
      int nComp = typical_values.size();
      FArrayBox tvfab(tvbox,nComp);
      for (int i=0; i<nComp; ++i) {
        tvfab.dataPtr()[i] = typical_values[i];
      }
      tvfab.writeOn(tvos);
    }
  }

  if (closed_chamber) {

      VisMF::IO_Buffer io_buffer(VisMF::IO_Buffer_Size);

      if (ParallelDescriptor::IOProcessor()) {

          std::ofstream PAMBFile;
          PAMBFile.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());
          std::string PAMBFileName(dir + "/PAMB");
          PAMBFile.open(PAMBFileName.c_str(), std::ofstream::out   |
                        std::ofstream::trunc |
                        std::ofstream::binary);

          if( !PAMBFile.good()) {
              amrex::FileOpenFailed(PAMBFileName);
          }

          PAMBFile.precision(17);

          int step = parent->levelSteps(0);

          // write out title line
          PAMBFile << "Writing p_amb to checkpoint\n";
          if (step == 0) {
              PAMBFile << p_amb_old << "\n";
          }
          else {
              PAMBFile << p_amb_new << "\n";
          }
      }
  }
}